

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int parse_base128_integer(CBS *cbs,uint64_t *out)

{
  int iVar1;
  byte local_29;
  ulong uStack_28;
  uint8_t b;
  uint64_t v;
  uint64_t *out_local;
  CBS *cbs_local;
  
  uStack_28 = 0;
  v = (uint64_t)out;
  out_local = (uint64_t *)cbs;
  while( true ) {
    iVar1 = CBS_get_u8((CBS *)out_local,&local_29);
    if (iVar1 == 0) {
      return 0;
    }
    if (uStack_28 >> 0x39 != 0) break;
    if ((uStack_28 == 0) && (local_29 == 0x80)) {
      return 0;
    }
    uStack_28 = uStack_28 << 7 | (long)(int)(local_29 & 0x7f);
    if ((local_29 & 0x80) == 0) {
      *(ulong *)v = uStack_28;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int parse_base128_integer(CBS *cbs, uint64_t *out) {
  uint64_t v = 0;
  uint8_t b;
  do {
    if (!CBS_get_u8(cbs, &b)) {
      return 0;
    }
    if ((v >> (64 - 7)) != 0) {
      // The value is too large.
      return 0;
    }
    if (v == 0 && b == 0x80) {
      // The value must be minimally encoded.
      return 0;
    }
    v = (v << 7) | (b & 0x7f);

    // Values end at an octet with the high bit cleared.
  } while (b & 0x80);

  *out = v;
  return 1;
}